

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall
ON_SubDMeshFragmentGrid::GetGridParameters
          (ON_SubDMeshFragmentGrid *this,uint grid_point_index,double *grid_parameters)

{
  byte bVar1;
  byte bVar2;
  ON_2udex OVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = this->m_side_segment_count;
  bVar2 = 1;
  if ((bVar1 != 0) && (grid_point_index < (bVar1 + 1) * (bVar1 + 1))) {
    OVar3 = Grid2dexFromPointIndex(this,grid_point_index);
    uVar4 = (uint)bVar1;
    dVar5 = 1.0;
    if (OVar3.i < uVar4) {
      dVar6 = (double)(int)OVar3.i / (double)uVar4;
    }
    else {
      dVar6 = 1.0;
    }
    *grid_parameters = dVar6;
    if (OVar3.j < uVar4) {
      dVar5 = (double)(int)OVar3.j / (double)uVar4;
    }
    grid_parameters[1] = dVar5;
    bVar2 = 0;
  }
  if (bVar2 != 0) {
    *grid_parameters = -1.23432101234321e+308;
    grid_parameters[1] = -1.23432101234321e+308;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool ON_SubDMeshFragmentGrid::GetGridParameters(
  unsigned int grid_point_index,
  double grid_parameters[2]
  ) const
{
  for (;;)
  {
    const unsigned int side_segment_count = SideSegmentCount();
    if ( 0 == side_segment_count )
      break;
    const unsigned int grid_side_point_count = side_segment_count + 1;
    if (grid_point_index >= grid_side_point_count*grid_side_point_count)
      break;
    const ON_2udex g2dex = Grid2dexFromPointIndex(grid_point_index);

    grid_parameters[0]
      = (g2dex.i < side_segment_count)
      ? (((double)g2dex.i) / ((double)side_segment_count))
      : 1.0;
    grid_parameters[1]
      = (g2dex.j < side_segment_count)
      ? (((double)g2dex.j) / ((double)side_segment_count))
      : 1.0;
    return true;
  }
  grid_parameters[0] = ON_UNSET_VALUE;
  grid_parameters[1] = ON_UNSET_VALUE;
  return false;
}